

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O2

int wally_psbt_get_version(wally_psbt *psbt,size_t *written)

{
  int iVar1;
  
  iVar1 = -2;
  if ((written != (size_t *)0x0) && (*written = 0, psbt != (wally_psbt *)0x0)) {
    *written = (ulong)psbt->version;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

PSBT_GET(version)
PSBT_GET(num_inputs)
PSBT_GET(num_outputs)

int wally_psbt_is_finalized(const struct wally_psbt *psbt,
                            size_t *written)
{
    size_t i;

    if (written)
        *written = 0;
    if (!psbt || !written)
        return WALLY_EINVAL;

    for (i = 0; i < psbt->num_inputs; ++i) {
        if (!psbt->inputs[i].final_scriptsig && !psbt->inputs[i].final_witness)
            return WALLY_OK; /* Non fully finalized */
    }
    /* We are finalized if we have inputs since they are all finalized */
    *written = psbt->num_inputs > 0 ?  1 : 0;
    return WALLY_OK;
}